

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jutils.c
# Opt level: O0

void jcopy_sample_rows(JSAMPARRAY input_array,int source_row,JSAMPARRAY output_array,int dest_row,
                      int num_rows,JDIMENSION num_cols)

{
  int local_4c;
  int row;
  size_t count;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JDIMENSION num_cols_local;
  int num_rows_local;
  int dest_row_local;
  JSAMPARRAY output_array_local;
  JSAMPARRAY ppJStack_10;
  int source_row_local;
  JSAMPARRAY input_array_local;
  
  _num_rows_local = output_array + dest_row;
  ppJStack_10 = input_array + source_row;
  for (local_4c = num_rows; 0 < local_4c; local_4c = local_4c + -1) {
    memcpy(*_num_rows_local,*ppJStack_10,(ulong)num_cols);
    _num_rows_local = _num_rows_local + 1;
    ppJStack_10 = ppJStack_10 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_sample_rows (JSAMPARRAY input_array, int source_row,
		   JSAMPARRAY output_array, int dest_row,
		   int num_rows, JDIMENSION num_cols)
/* Copy some rows of samples from one place to another.
 * num_rows rows are copied from input_array[source_row++]
 * to output_array[dest_row++]; these areas may overlap for duplication.
 * The source and destination arrays must be at least as wide as num_cols.
 */
{
  register JSAMPROW inptr, outptr;
#ifdef FMEMCOPY
  register size_t count = (size_t) (num_cols * SIZEOF(JSAMPLE));
#else
  register JDIMENSION count;
#endif
  register int row;

  input_array += source_row;
  output_array += dest_row;

  for (row = num_rows; row > 0; row--) {
    inptr = *input_array++;
    outptr = *output_array++;
#ifdef FMEMCOPY
    FMEMCOPY(outptr, inptr, count);
#else
    for (count = num_cols; count > 0; count--)
      *outptr++ = *inptr++;	/* needn't bother with GETJSAMPLE() here */
#endif
  }
}